

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenGEXImporter.cpp
# Opt level: O0

void __thiscall
Assimp::OpenGEX::OpenGEXImporter::handleColorNode
          (OpenGEXImporter *this,DDLNode *node,aiScene *param_2)

{
  ColorType CVar1;
  Property *pPVar2;
  DataArrayList *colList_00;
  undefined1 local_90 [4];
  ColorType colType;
  aiColor4D col4;
  aiColor3D col3;
  aiColor3D col;
  DataArrayList *colList;
  allocator<char> local_49;
  string local_48;
  Property *local_28;
  Property *prop;
  aiScene *param_2_local;
  DDLNode *node_local;
  OpenGEXImporter *this_local;
  
  if (node != (DDLNode *)0x0) {
    prop = (Property *)param_2;
    param_2_local = (aiScene *)node;
    node_local = (DDLNode *)this;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"attrib",&local_49);
    pPVar2 = ODDLParser::DDLNode::findPropertyByName(node,&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    std::allocator<char>::~allocator(&local_49);
    if (((pPVar2 != (Property *)0x0) && (pPVar2->m_value != (Value *)0x0)) &&
       (local_28 = pPVar2,
       colList_00 = ODDLParser::DDLNode::getDataArrayList((DDLNode *)param_2_local),
       colList_00 != (DataArrayList *)0x0)) {
      aiColor3D::aiColor3D((aiColor3D *)&col3.g);
      if (colList_00->m_numItems == 3) {
        aiColor3D::aiColor3D((aiColor3D *)&col4.b);
        getColorRGB3((aiColor3D *)&col4.b,colList_00);
        aiColor3D::operator=((aiColor3D *)&col3.g,(aiColor3D *)&col4.b);
      }
      else {
        aiColor4t<float>::aiColor4t((aiColor4t<float> *)local_90);
        getColorRGB4((aiColor4D *)local_90,colList_00);
        col3.g = (ai_real)local_90;
        col3.b = (ai_real)colType;
      }
      CVar1 = getColorType(local_28->m_key);
      if (CVar1 == DiffuseColor) {
        aiMaterial::AddProperty(this->m_currentMaterial,(aiColor3D *)&col3.g,1,"$clr.diffuse",0,0);
      }
      else if (CVar1 == SpecularColor) {
        aiMaterial::AddProperty(this->m_currentMaterial,(aiColor3D *)&col3.g,1,"$clr.specular",0,0);
      }
      else if (CVar1 == EmissionColor) {
        aiMaterial::AddProperty(this->m_currentMaterial,(aiColor3D *)&col3.g,1,"$clr.emissive",0,0);
      }
      else if (CVar1 == LightColor) {
        aiColor3D::operator=(&this->m_currentLight->mColorDiffuse,(aiColor3D *)&col3.g);
      }
    }
  }
  return;
}

Assistant:

void OpenGEXImporter::handleColorNode( ODDLParser::DDLNode *node, aiScene * /*pScene*/ ) {
    if( nullptr == node ) {
        return;
    }

    Property *prop = node->findPropertyByName( "attrib" );
    if( nullptr != prop ) {
        if( nullptr != prop->m_value ) {
            DataArrayList *colList( node->getDataArrayList() );
            if( nullptr == colList ) {
                return;
            }
            aiColor3D col;
            if ( 3 == colList->m_numItems ) {
                aiColor3D col3;
                getColorRGB3( &col3, colList );
                col = col3;
            } else {
                aiColor4D col4;
                getColorRGB4( &col4, colList );
                col.r = col4.r;
                col.g = col4.g;
                col.b = col4.b;
            }
#ifdef ASSIMP_USE_HUNTER
            const ColorType colType( getColorType( &prop->m_key->m_text ) );
#else
            const ColorType colType( getColorType( prop->m_key ) );
#endif
            if( DiffuseColor == colType ) {
                m_currentMaterial->AddProperty( &col, 1, AI_MATKEY_COLOR_DIFFUSE );
            } else if( SpecularColor == colType ) {
                m_currentMaterial->AddProperty( &col, 1, AI_MATKEY_COLOR_SPECULAR );
            } else if( EmissionColor == colType ) {
                m_currentMaterial->AddProperty( &col, 1, AI_MATKEY_COLOR_EMISSIVE );
            } else if ( LightColor == colType ) {
                m_currentLight->mColorDiffuse = col;
            }
        }
    }
}